

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

bool __thiscall ON_3dmConstructionPlane::Write(ON_3dmConstructionPlane *this,ON_BinaryArchive *file)

{
  bool local_19;
  bool rc;
  ON_BinaryArchive *file_local;
  ON_3dmConstructionPlane *this_local;
  
  local_19 = ON_BinaryArchive::Write3dmChunkVersion(file,1,1);
  if (local_19) {
    local_19 = ON_BinaryArchive::WritePlane(file,&this->m_plane);
  }
  if (local_19 != false) {
    local_19 = ON_BinaryArchive::WriteDouble(file,this->m_grid_spacing);
  }
  if (local_19 != false) {
    local_19 = ON_BinaryArchive::WriteDouble(file,this->m_snap_spacing);
  }
  if (local_19 != false) {
    local_19 = ON_BinaryArchive::WriteInt(file,this->m_grid_line_count);
  }
  if (local_19 != false) {
    local_19 = ON_BinaryArchive::WriteInt(file,this->m_grid_thick_frequency);
  }
  if (local_19 != false) {
    local_19 = ON_BinaryArchive::WriteString(file,&this->m_name);
  }
  if (local_19 != false) {
    local_19 = ON_BinaryArchive::WriteBool(file,(bool)(this->m_bDepthBuffer & 1));
  }
  return local_19;
}

Assistant:

bool ON_3dmConstructionPlane::Write( ON_BinaryArchive& file ) const
{
  bool rc = file.Write3dmChunkVersion(1,1);

  if (rc) rc = file.WritePlane(m_plane);
  if (rc) rc = file.WriteDouble(m_grid_spacing);
  if (rc) rc = file.WriteDouble(m_snap_spacing);
  if (rc) rc = file.WriteInt(m_grid_line_count);
  if (rc) rc = file.WriteInt(m_grid_thick_frequency);
  if (rc) rc = file.WriteString(m_name);

  // added for version 1.1 chunks
  if (rc) rc = file.WriteBool(m_bDepthBuffer);

  return rc;
}